

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosComm.cpp
# Opt level: O2

string * __thiscall
adios2::helper::Comm::BroadcastFile
          (string *__return_storage_ptr__,Comm *this,string *fileName,string *hint,int rankSource)

{
  int iVar1;
  string sStack_68;
  string local_48;
  
  iVar1 = (*((this->m_Impl)._M_t.
             super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
             ._M_t.
             super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
             .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl)->_vptr_CommImpl
            [7])();
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (iVar1 == rankSource) {
    std::__cxx11::string::string((string *)&sStack_68,(string *)hint);
    FileToString(&local_48,fileName,&sStack_68);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&sStack_68);
  }
  BroadcastValue<std::__cxx11::string>(&local_48,this,__return_storage_ptr__,rankSource);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string Comm::BroadcastFile(const std::string &fileName, const std::string hint,
                                const int rankSource) const
{
    int rank = this->Rank();
    std::string fileContents;

    // Read the file on rank 0 and broadcast it to everybody else
    if (rank == rankSource)
    {
        // load file contents
        fileContents = FileToString(fileName, hint);
    }
    fileContents = this->BroadcastValue(fileContents, rankSource);

    return fileContents;
}